

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calc.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  Identifier local_3d0;
  Identifier local_3a8;
  Identifier local_380;
  Identifier local_348;
  undefined1 local_320 [8];
  Context<char> context;
  char **argv_local;
  int argc_local;
  
  context.m_callbacks.
  super__Vector_base<void_*(*)(const_Centaurus::SymbolContext<char>_&),_std::allocator<void_*(*)(const_Centaurus::SymbolContext<char>_&)>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)argv;
  Centaurus::Context<char>::Context((Context<char> *)local_320,"../grammars/calc.cgr");
  Centaurus::Identifier::Identifier(&local_348,L"INPUT");
  Centaurus::Context<char>::attach((Context<char> *)local_320,&local_348,parse_INPUT);
  Centaurus::Identifier::~Identifier(&local_348);
  Centaurus::Identifier::Identifier(&local_380,L"EXPR");
  Centaurus::Context<char>::attach((Context<char> *)local_320,&local_380,parse_EXPR);
  Centaurus::Identifier::~Identifier(&local_380);
  Centaurus::Identifier::Identifier(&local_3a8,L"TERM");
  Centaurus::Context<char>::attach((Context<char> *)local_320,&local_3a8,parse_TERM);
  Centaurus::Identifier::~Identifier(&local_3a8);
  Centaurus::Identifier::Identifier(&local_3d0,L"FACT");
  Centaurus::Context<char>::attach((Context<char> *)local_320,&local_3d0,parse_FACT);
  Centaurus::Identifier::~Identifier(&local_3d0);
  Centaurus::Context<char>::parse
            ((Context<char> *)local_320,
             (char *)context.m_callbacks.
                     super__Vector_base<void_*(*)(const_Centaurus::SymbolContext<char>_&),_std::allocator<void_*(*)(const_Centaurus::SymbolContext<char>_&)>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage[1],1);
  printf("Result = %d\n",(ulong)(uint)result);
  Centaurus::Context<char>::~Context((Context<char> *)local_320);
  return 0;
}

Assistant:

int main(int argc, const char *argv[])
{
    Context<char> context{"../grammars/calc.cgr"};

    context.attach(L"INPUT", parse_INPUT);
    context.attach(L"EXPR", parse_EXPR);
    context.attach(L"TERM", parse_TERM);
    context.attach(L"FACT", parse_FACT);

    context.parse(argv[1], 1);

    printf("Result = %d\n", result);

    return 0;
}